

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall
LowererMDArch::MovArgFromReg2Stack
          (LowererMDArch *this,Instr *instr,RegNum reg,uint16 slotNumber,IRType type)

{
  OpCode opcode;
  StackSym *sym;
  SymOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  Instr *instr_00;
  Instr *movInstr;
  RegOpnd *src;
  SymOpnd *dst;
  StackSym *slotSym;
  IRType type_local;
  uint16 slotNumber_local;
  RegNum reg_local;
  Instr *instr_local;
  LowererMDArch *this_local;
  
  sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,slotNumber + 1);
  sym->m_type = type;
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
  src1Opnd = IR::RegOpnd::New((StackSym *)0x0,reg,type,this->m_func);
  opcode = GetAssignOp(type);
  instr_00 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertAfter(instr,instr_00);
  return;
}

Assistant:

void
LowererMDArch::MovArgFromReg2Stack(IR::Instr * instr, RegNum reg, uint16 slotNumber, IRType type)
{
    StackSym *          slotSym   = this->m_func->m_symTable->GetArgSlotSym(slotNumber + 1);
    slotSym->m_type = type;
    IR::SymOpnd *       dst       = IR::SymOpnd::New(slotSym, type,  this->m_func);
    IR::RegOpnd *       src       = IR::RegOpnd::New(nullptr, reg, type,  this->m_func);
    IR::Instr *         movInstr =  IR::Instr::New(GetAssignOp(type), dst, src, this->m_func);
    instr->InsertAfter(movInstr);
}